

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

void absl::lts_20250127::str_format_internal::anon_unknown_0::WriteBufferToSink
               (char sign_char,string_view str,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  FormatSinkImpl *in_R9;
  size_t n;
  
  if ((int)sink < 0) {
    n = 0;
  }
  else {
    uVar2 = (str._M_len + 1) - (ulong)(sign_char == '\0');
    n = 0;
    if (uVar2 <= ((ulong)sink & 0xffffffff)) {
      n = ((ulong)sink & 0xffffffff) - uVar2;
    }
  }
  sVar1 = 0;
  if (((ulong)conv & 0x11) == 0) {
    sVar1 = n;
  }
  FormatSinkImpl::Append(in_R9,sVar1,' ');
  if (sign_char != '\0') {
    FormatSinkImpl::Append(in_R9,1,sign_char);
  }
  sVar1 = 0;
  sVar3 = n;
  if (((ulong)conv & 0x10) == 0) {
    sVar3 = sVar1;
  }
  if (((ulong)conv & 1) == 0) {
    n = sVar1;
    sVar1 = sVar3;
  }
  FormatSinkImpl::Append(in_R9,sVar1,'0');
  FormatSinkImpl::Append(in_R9,str);
  FormatSinkImpl::Append(in_R9,n,' ');
  return;
}

Assistant:

void WriteBufferToSink(char sign_char, absl::string_view str,
                       const FormatConversionSpecImpl &conv,
                       FormatSinkImpl *sink) {
  size_t left_spaces = 0, zeros = 0, right_spaces = 0;
  size_t missing_chars = 0;
  if (conv.width() >= 0) {
    const size_t conv_width_size_t = static_cast<size_t>(conv.width());
    const size_t existing_chars =
        str.size() + static_cast<size_t>(sign_char != 0);
    if (conv_width_size_t > existing_chars)
      missing_chars = conv_width_size_t - existing_chars;
  }
  if (conv.has_left_flag()) {
    right_spaces = missing_chars;
  } else if (conv.has_zero_flag()) {
    zeros = missing_chars;
  } else {
    left_spaces = missing_chars;
  }

  sink->Append(left_spaces, ' ');
  if (sign_char != '\0') sink->Append(1, sign_char);
  sink->Append(zeros, '0');
  sink->Append(str);
  sink->Append(right_spaces, ' ');
}